

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

reference __thiscall
nonstd::span_lite::span<unsigned_char,_18446744073709551615UL>::operator[]
          (span<unsigned_char,_18446744073709551615UL> *this,size_type idx)

{
  logic_error *this_00;
  undefined **local_20 [2];
  
  if (idx < this->size_) {
    return this->data_ + idx;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            ((logic_error *)local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1241: Precondition violation."
            );
  local_20[0] = &PTR__logic_error_001e9b38;
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001e9b38;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp reference operator[]( size_type idx ) const
    {
        span_EXPECTS( detail::is_positive( idx ) && idx < size() );

        return *( data() + idx );
    }